

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.hh
# Opt level: O2

size_t __thiscall
helix::nasdaq::nordic_itch_handler::process_packet(nordic_itch_handler *this,packet_view *packet)

{
  size_t sVar1;
  size_t sStack_8;
  
  switch(*packet->_buf) {
  case 'A':
    sVar1 = process_msg<itch_add_order>(this,packet);
    return sVar1;
  case 'B':
    sStack_8 = 10;
    break;
  case 'C':
    sVar1 = process_msg<itch_order_executed_with_price>(this,packet);
    return sVar1;
  case 'D':
    sVar1 = process_msg<itch_order_delete>(this,packet);
    return sVar1;
  case 'E':
    sVar1 = process_msg<itch_order_executed>(this,packet);
    return sVar1;
  case 'F':
    sVar1 = process_msg<itch_add_order_mpid>(this,packet);
    return sVar1;
  default:
    return 0;
  case 'H':
    sVar1 = process_msg<itch_order_book_trading_action>(this,packet);
    return sVar1;
  case 'I':
    return 0x4b;
  case 'M':
    sVar1 = process_msg<itch_milliseconds>(this,packet);
    return sVar1;
  case 'O':
    sStack_8 = 5;
    break;
  case 'P':
    sVar1 = process_msg<itch_trade>(this,packet);
    return sVar1;
  case 'Q':
    sVar1 = process_msg<itch_cross_trade>(this,packet);
    return sVar1;
  case 'R':
    sVar1 = process_msg<itch_order_book_directory>(this,packet);
    return sVar1;
  case 'S':
    sStack_8 = 2;
    break;
  case 'T':
    sVar1 = process_msg<itch_seconds>(this,packet);
    return sVar1;
  case 'X':
    sVar1 = process_msg<itch_order_cancel>(this,packet);
    return sVar1;
  }
  return sStack_8;
}

Assistant:

const T* cast() const {
        return reinterpret_cast<const T*>(_buf);
    }